

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitInterpolationExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,InterpolationExpr *expr)

{
  type expr_00;
  type pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  InterpolationExpr *local_20;
  InterpolationExpr *expr_local;
  AstSerialise *this_local;
  
  local_20 = expr;
  expr_local = (InterpolationExpr *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  expr_00 = std::unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_>::operator*
                      (&expr->start);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_a0,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,&expr_00->super_Expr);
  std::operator+(&local_80,&local_a0,"\\(");
  pEVar1 = std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator*
                     (&local_20->interpolated);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_d0,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,pEVar1);
  std::operator+(&local_60,&local_80,&local_d0);
  std::operator+(&local_40,&local_60,")");
  pEVar1 = std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator*
                     (&local_20->end);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_f0,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,pEVar1);
  std::operator+(__return_storage_ptr__,&local_40,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitInterpolationExpr(InterpolationExpr &expr) {
        return visitExpr(*expr.start) + "\\(" + visitExpr(*expr.interpolated) + ")" + visitExpr(*expr.end);
    }